

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_13::CorruptionReporter::Corruption
          (CorruptionReporter *this,size_t bytes,Status *status)

{
  string *in_RDI;
  string r;
  Slice *this_00;
  undefined1 local_78 [16];
  uint64_t in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [16];
  Status *in_stack_ffffffffffffffd8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  std::allocator<char>::~allocator(&local_39);
  AppendNumberTo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::operator+=(local_38," bytes; ");
  Status::ToString_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::__cxx11::string::operator+=(local_38,(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::push_back((char)local_38);
  this_00 = (Slice *)in_RDI->_M_string_length;
  Slice::Slice(this_00,in_RDI);
  (**(code **)(this_00->data_ + 0x10))(&stack0xffffffffffffff98,this_00,local_78);
  Status::~Status((Status *)this_00);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& status) override {
    std::string r = "corruption: ";
    AppendNumberTo(&r, bytes);
    r += " bytes; ";
    r += status.ToString();
    r.push_back('\n');
    dst_->Append(r);
  }